

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::addSatSI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  char cVar1;
  int32_t iVar2;
  int32_t iVar3;
  Literal *other_local;
  Literal *this_local;
  
  iVar2 = geti32(this);
  iVar3 = geti32(other);
  cVar1 = add_sat_s<signed_char>((char)iVar2,(char)iVar3);
  Literal(__return_storage_ptr__,(int)cVar1);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::addSatSI8(const Literal& other) const {
  return Literal(add_sat_s<int8_t>(geti32(), other.geti32()));
}